

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O3

bool __thiscall cmCTestBZR::StatusParser::ProcessLine(StatusParser *this)

{
  char *pcVar1;
  bool bVar2;
  char c0;
  char c1;
  char c2;
  char *local_b0;
  undefined8 local_a8;
  char local_a0;
  undefined7 uStack_9f;
  char *local_90;
  undefined8 local_88;
  char local_80;
  undefined7 uStack_7f;
  string local_70;
  char *local_50;
  undefined8 local_48;
  char local_40;
  undefined7 uStack_3f;
  
  bVar2 = cmsys::RegularExpression::find
                    (&this->RegexStatus,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexStatus).regmatch);
  if (bVar2) {
    pcVar1 = (this->RegexStatus).regmatch.startp[1];
    local_90 = &local_80;
    if (pcVar1 == (char *)0x0) {
      local_88 = 0;
      local_80 = '\0';
      c0 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_90,pcVar1,(this->RegexStatus).regmatch.endp[1]);
      c0 = *local_90;
    }
    pcVar1 = (this->RegexStatus).regmatch.startp[2];
    local_b0 = &local_a0;
    if (pcVar1 == (char *)0x0) {
      local_a8 = 0;
      local_a0 = '\0';
      c1 = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,pcVar1,(this->RegexStatus).regmatch.endp[2]);
      c1 = *local_b0;
    }
    pcVar1 = (this->RegexStatus).regmatch.startp[3];
    if (pcVar1 == (char *)0x0) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
      c2 = '\0';
    }
    else {
      local_50 = &local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,pcVar1,(this->RegexStatus).regmatch.endp[3]);
      c2 = *local_50;
    }
    pcVar1 = (this->RegexStatus).regmatch.startp[4];
    if (pcVar1 == (char *)0x0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar1,(this->RegexStatus).regmatch.endp[4]);
    }
    DoPath(this,c0,c1,c2,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
  }
  return true;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexStatus.find(this->Line)) {
      this->DoPath(this->RegexStatus.match(1)[0],
                   this->RegexStatus.match(2)[0],
                   this->RegexStatus.match(3)[0], this->RegexStatus.match(4));
    }
    return true;
  }